

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

gravity_range_t * gravity_range_deserialize(gravity_vm *vm,json_value *json)

{
  char *pcVar1;
  char *__s;
  long lVar2;
  bool bVar3;
  int iVar4;
  size_t n;
  gravity_range_t *pgVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  gravity_int_t local_60;
  gravity_int_t local_58;
  
  uVar6 = (ulong)(json->u).string.length;
  bVar9 = uVar6 >= 2;
  if (uVar6 < 2) {
    local_60 = 0;
    local_58 = 0;
  }
  else {
    uVar7 = 2;
    lVar8 = 0;
    local_58 = 0;
    local_60 = 0;
    do {
      pcVar1 = (json->u).string.ptr;
      __s = *(char **)(pcVar1 + lVar8 + 0x18);
      lVar2 = *(long *)(pcVar1 + lVar8 + 0x28);
      n = strlen(__s);
      iVar4 = string_casencmp(__s,"from",n);
      if (iVar4 == 0) {
        bVar3 = true;
        if (*(int *)(lVar2 + 8) == 3) {
          local_58 = *(gravity_int_t *)(lVar2 + 0x10);
          goto LAB_0013a177;
        }
      }
      else {
        iVar4 = string_casencmp(__s,"to",n);
        bVar3 = false;
        if ((iVar4 == 0) && (bVar3 = true, *(int *)(lVar2 + 8) == 3)) {
          local_60 = *(gravity_int_t *)(lVar2 + 0x10);
LAB_0013a177:
          bVar3 = false;
        }
      }
      if (bVar3) break;
      bVar9 = uVar7 < uVar6;
      lVar8 = lVar8 + 0x18;
      uVar7 = uVar7 + 1;
    } while (uVar6 * 0x18 + -0x18 != lVar8);
  }
  if (!bVar9) {
    pgVar5 = gravity_range_new(vm,local_58,local_60,true);
    return pgVar5;
  }
  return (gravity_range_t *)0x0;
}

Assistant:

gravity_range_t *gravity_range_deserialize (gravity_vm *vm, json_value *json) {
    json_int_t from = 0;
    json_int_t to = 0;
    
    uint32_t n = json->u.object.length;
    for (uint32_t i=1; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *value = json->u.object.values[i].value;
        size_t label_size = strlen(label);
        
        // from
        if (string_casencmp(label, GRAVITY_JSON_LABELFROM, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            from = value->u.integer;
            continue;
        }
        
        // to
        if (string_casencmp(label, GRAVITY_JSON_LABELTO, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            to = value->u.integer;
            continue;
        }
    }
    
    return gravity_range_new(vm, (gravity_int_t)from, (gravity_int_t)to, true);
    
abort_load:
    return NULL;
}